

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_create_trap(command_conflict *cmd)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  _Bool _Var1;
  wchar_t wVar2;
  trap_kind_conflict1 *ptVar3;
  object *poVar4;
  uint local_74;
  trap_kind *trap;
  char s [80];
  wchar_t tidx;
  command_conflict *cmd_local;
  
  wVar2 = cmd_get_arg_number((command *)cmd,"index",(int *)(s + 0x4c));
  if (wVar2 != L'\0') {
    memset(&trap,0,0x50);
    _Var1 = get_string("Create which trap? ",(char *)&trap,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string((char *)&trap,(int *)(s + 0x4c));
    if (!_Var1) {
      ptVar3 = lookup_trap((char *)&trap);
      if (ptVar3 == (trap_kind_conflict1 *)0x0) {
        local_74 = (uint)z_info->trap_max;
      }
      else {
        local_74 = ptVar3->tidx;
      }
      s[0x4c] = (undefined1)local_74;
      s[0x4d] = local_74._1_1_;
      s[0x4e] = local_74._2_1_;
      s[0x4f] = local_74._3_1_;
    }
    cmd_set_arg_number((command *)cmd,"index",s._76_4_);
  }
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  _Var1 = square_isfloor((chunk *)cave,grid);
  if ((((!_Var1) ||
       (grid_00.x = (player->grid).x, grid_00.y = (player->grid).y,
       _Var1 = square_isplayertrap((chunk *)cave,grid_00), _Var1)) ||
      (grid_01.x = (player->grid).x, grid_01.y = (player->grid).y,
      _Var1 = square_iswebbed((chunk *)cave,grid_01), _Var1)) ||
     (grid_02.x = (player->grid).x, grid_02.y = (player->grid).y,
     poVar4 = square_object((chunk *)cave,grid_02), poVar4 != (object *)0x0)) {
    msg("You can\'t place a trap there!");
  }
  else if (player->depth == 0) {
    msg("You can\'t place a trap in the town!");
  }
  else if (((int)s._76_4_ < 1) || ((int)(uint)z_info->trap_max <= (int)s._76_4_)) {
    msg("Trap not found.");
  }
  else {
    grid_03.x = (player->grid).x;
    grid_03.y = (player->grid).y;
    place_trap((chunk_conflict2 *)cave,grid_03,s._76_4_,L'\0');
    cmd_disable_repeat();
  }
  return;
}

Assistant:

void do_cmd_wiz_create_trap(struct command *cmd)
{
	int tidx;

	if (cmd_get_arg_number(cmd, "index", &tidx) != CMD_OK) {
		char s[80] = "";

		if (!get_string("Create which trap? ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &tidx)) {
			const struct trap_kind *trap = lookup_trap(s);

			tidx = (trap) ? trap->tidx : z_info->trap_max;
		}
		cmd_set_arg_number(cmd, "index", tidx);
	}

	if (!square_isfloor(cave, player->grid)
			|| square_isplayertrap(cave, player->grid)
			|| square_iswebbed(cave, player->grid)
			|| square_object(cave, player->grid)) {
		msg("You can't place a trap there!");
	} else if (player->depth == 0) {
		msg("You can't place a trap in the town!");
	} else if (tidx < 1 || tidx >= z_info->trap_max) {
		msg("Trap not found.");
	} else {
		place_trap(cave, player->grid, tidx, 0);
		/* Can not repeat since there's now a trap here. */
		cmd_disable_repeat();
	}
}